

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ufiber.hpp
# Opt level: O0

fiber __thiscall
ufiber::detail::
fiber_main<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/djarek[P]ufiber/tests/ufiber/yield_token_conversion.cpp:23:7),_boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>,_ufiber::broken_promise>
::operator()(fiber_main<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_djarek[P]ufiber_tests_ufiber_yield_token_conversion_cpp:23:7),_boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>,_ufiber::broken_promise>
             *this,fiber *fiber)

{
  undefined1 *this_00;
  fiber *in_RDX;
  broken_promise *anon_var_0;
  undefined1 local_40 [8];
  yield_token<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_> token;
  fiber_context ctx;
  fiber *fiber_local;
  fiber_main<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_djarek[P]ufiber_tests_ufiber_yield_token_conversion_cpp:23:7),_boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>,_ufiber::broken_promise>
  *this_local;
  
  this_00 = &token.executor_.field_0x8;
  fiber_context::fiber_context((fiber_context *)this_00,in_RDX);
  yield_token<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>::yield_token
            ((yield_token<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_> *
             )local_40,(basic_executor_type<std::allocator<void>,_0U> *)(fiber + 1),
             (fiber_context *)this_00);
  boost::asio::
  post<ufiber::yield_token<boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>>&>
            ((yield_token<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_> *
             )local_40);
  yield_token<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>::yield_token
            ((yield_token<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_> *
             )&anon_var_0,
             (yield_token<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_> *
             )local_40);
  anon_class_8_1_a7c1402f_for_f_::operator()
            ((anon_class_8_1_a7c1402f_for_f_ *)fiber,
             (yield_token<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_> *
             )&anon_var_0);
  yield_token<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>::~yield_token
            ((yield_token<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_> *
             )&anon_var_0);
  yield_token<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>::~yield_token
            ((yield_token<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_> *
             )local_40);
  fiber_context::final_suspend((fiber_context *)this);
  fiber_context::~fiber_context((fiber_context *)&token.executor_.field_0x8);
  return (fiber)this;
}

Assistant:

boost::context::fiber operator()(boost::context::fiber&& fiber)
    {
        fiber_context ctx{std::move(fiber)};
        BOOST_TRY
        {
            yield_token<Executor> token{std::move(executor_), ctx};
            boost::asio::post(token);
            f_(std::move(token));
        }